

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseSingleLocalizedDigit
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,int32_t *len)

{
  int32_t iVar1;
  UChar32 c;
  int32_t local_4c;
  int32_t next;
  int32_t tmp;
  int32_t i;
  UChar32 cp;
  int32_t digit;
  int32_t *len_local;
  int32_t start_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  i = -1;
  *len = 0;
  iVar1 = UnicodeString::length(text);
  if (start < iVar1) {
    c = UnicodeString::char32At(text,start);
    for (next = 0; next < 10; next = next + 1) {
      if (c == this->fGMTOffsetDigits[next]) {
        i = next;
        break;
      }
    }
    if (i < 0) {
      local_4c = u_charDigitValue_63(c);
      if ((local_4c < 0) || (9 < local_4c)) {
        local_4c = -1;
      }
      i = local_4c;
    }
    if (-1 < i) {
      iVar1 = UnicodeString::moveIndex32(text,start,1);
      *len = iVar1 - start;
    }
  }
  return i;
}

Assistant:

int32_t
TimeZoneFormat::parseSingleLocalizedDigit(const UnicodeString& text, int32_t start, int32_t& len) const {
    int32_t digit = -1;
    len = 0;
    if (start < text.length()) {
        UChar32 cp = text.char32At(start);

        // First, try digits configured for this instance
        for (int32_t i = 0; i < 10; i++) {
            if (cp == fGMTOffsetDigits[i]) {
                digit = i;
                break;
            }
        }
        // If failed, check if this is a Unicode digit
        if (digit < 0) {
            int32_t tmp = u_charDigitValue(cp);
            digit = (tmp >= 0 && tmp <= 9) ? tmp : -1;
        }

        if (digit >= 0) {
            int32_t next = text.moveIndex32(start, 1);
            len = next - start;
        }
    }
    return digit;
}